

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

int __thiscall
CTcTokenizer::expand_macros
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcTokString *expbuf,int read_more,
          int allow_defined,int append)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  tc_toktyp_t tVar4;
  int iVar5;
  int iVar6;
  CTcMacroRsc *rsc;
  CTcHashEntryPp *entry;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar7;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  char **ppcVar8;
  size_t sVar9;
  size_t local_c0;
  int expanded;
  size_t *local_a8;
  CTcTokString *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  size_t local_88;
  utf8_ptr local_src;
  CTcToken tok;
  CTcTokString local_50;
  undefined4 extraout_var;
  
  local_98 = CONCAT44(in_register_0000008c,allow_defined);
  local_90 = CONCAT44(in_register_00000084,read_more);
  local_src.p_ = (char *)0x0;
  local_50._vptr_CTcTokString = (_func_int **)&PTR__CTcTokStringRef_0031ccf8;
  local_50.buf_ = (char *)0x0;
  local_50.buf_size_ = 0;
  local_50.buf_len_ = 0;
  rsc = alloc_macro_rsc(this);
  if (rsc == (CTcMacroRsc *)0x0) {
    iVar6 = 1;
  }
  else {
    if (srcbuf == (CTcTokString *)0x0) {
      ppcVar8 = &local_50.buf_;
      pcVar2 = src->p_;
      local_50.buf_len_ = strlen(pcVar2);
      local_50.buf_size_ = local_50.buf_len_ + 1;
      srcbuf = &local_50;
      local_a8 = &local_50.buf_len_;
      local_50.buf_ = pcVar2;
    }
    else {
      ppcVar8 = &srcbuf->buf_;
      local_a8 = &srcbuf->buf_len_;
      if (src == (utf8_ptr *)0x0) {
        local_src.p_ = *ppcVar8;
        src = &local_src;
      }
    }
    if (append == 0) {
      (*expbuf->_vptr_CTcTokString[9])(expbuf);
    }
    local_a0 = expbuf;
    (*expbuf->_vptr_CTcTokString[2])(expbuf,*local_a8 + expbuf->buf_len_);
    local_c0 = (long)src->p_ - (long)*ppcVar8;
LAB_0021da75:
    do {
      tVar4 = next_on_line(srcbuf,src,&tok,&this->macro_in_embedding_,1);
      sVar9 = tok.text_len_;
      pcVar2 = tok.text_;
      if (tVar4 == TOKT_SYM) {
        if ((tok._32_1_ & 1) != 0) goto LAB_0021da75;
        iVar6 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,tok.text_,tok.text_len_);
        entry = (CTcHashEntryPp *)CONCAT44(extraout_var,iVar6);
        if ((entry == (CTcHashEntryPp *)0x0) ||
           (iVar6 = scan_for_prior_expansion((utf8_ptr)src->p_,*ppcVar8 + *local_a8,entry),
           iVar6 != 0)) {
          if ((sVar9 != 7 || (int)local_98 == 0) ||
             (*(int *)(pcVar2 + 3) != 0x64656e69 || *(int *)pcVar2 != 0x69666564))
          goto LAB_0021da75;
          sVar9 = (long)pcVar2 - (long)*ppcVar8;
          if (entry != (CTcHashEntryPp *)0x0) goto LAB_0021db63;
          iVar6 = expand_defined(this,&rsc->line_exp_,srcbuf,src);
          expanded = 1;
        }
        else {
          sVar9 = (long)pcVar2 - (long)*ppcVar8;
LAB_0021db63:
          iVar6 = expand_macro(this,rsc,&rsc->line_exp_,srcbuf,src,sVar9,entry,(int)local_90,
                               (int)local_98,&expanded);
        }
        if (iVar6 != 0) {
          iVar6 = 1;
          goto LAB_0021dcbe;
        }
        if (expanded != 0) {
          (*local_a0->_vptr_CTcTokString[4])(local_a0,*ppcVar8 + local_c0,sVar9 - local_c0);
          lVar7 = (long)src->p_ - (long)*ppcVar8;
          if ((int)local_90 == 0) {
            (*(rsc->line_exp_)._vptr_CTcTokString[4])(rsc,*ppcVar8 + lVar7);
            iVar6 = expand_macros(this,&rsc->line_exp_,(utf8_ptr *)0x0,local_a0,0,(int)local_98,1);
            goto LAB_0021dcbe;
          }
          lVar1 = (*local_a8 - lVar7) + sVar9;
          local_88 = *local_a8 - lVar7;
          (*srcbuf->_vptr_CTcTokString[2])(srcbuf,(rsc->line_exp_).buf_len_ + lVar1);
          iVar6 = (*srcbuf->_vptr_CTcTokString[10])(srcbuf);
          src->p_ = (char *)(CONCAT44(extraout_var_00,iVar6) + sVar9);
          iVar6 = (*srcbuf->_vptr_CTcTokString[10])(srcbuf);
          sVar3 = (rsc->line_exp_).buf_len_;
          iVar5 = (*srcbuf->_vptr_CTcTokString[10])(srcbuf);
          memmove((void *)(CONCAT44(extraout_var_01,iVar6) + sVar9 + sVar3),
                  (void *)(lVar7 + CONCAT44(extraout_var_02,iVar5)),local_88);
          iVar6 = (*srcbuf->_vptr_CTcTokString[10])(srcbuf);
          iVar5 = (*(rsc->line_exp_)._vptr_CTcTokString[10])(rsc);
          memcpy((void *)(CONCAT44(extraout_var_03,iVar6) + sVar9),
                 (void *)CONCAT44(extraout_var_04,iVar5),(rsc->line_exp_).buf_len_);
          (*srcbuf->_vptr_CTcTokString[0xb])(srcbuf,lVar1 + (rsc->line_exp_).buf_len_);
          local_c0 = sVar9;
        }
        goto LAB_0021da75;
      }
    } while (tVar4 != TOKT_EOF);
    (*local_a0->_vptr_CTcTokString[4])
              (local_a0,*ppcVar8 + local_c0,tok.text_ + (-(long)*ppcVar8 - local_c0));
    iVar6 = 0;
LAB_0021dcbe:
    rsc->next_avail_ = this->macro_res_avail_;
    this->macro_res_avail_ = rsc;
  }
  return iVar6;
}

Assistant:

int CTcTokenizer::expand_macros(CTcTokString *srcbuf, utf8_ptr *src,
                                CTcTokString *expbuf, int read_more,
                                int allow_defined, int append)
{
    tc_toktyp_t typ;
    CTcToken tok;
    CTcTokString *subexp;
    size_t startofs;
    utf8_ptr local_src;
    CTcTokStringRef local_srcbuf;
    CTcMacroRsc *res;
    int err;

    /* presume success */
    err = 0;

    /* get a macro expansion resource object */
    res = alloc_macro_rsc();
    if (res == 0)
        return 1;

    /* get our subexpression buffer from the resource object */
    subexp = &res->line_exp_;

    /* if there's no source buffer or source pointer, provide one */
    if (srcbuf == 0)
    {
        /* 
         *   there's no source buffer - provide our own non-allocated
         *   buffer tied to the caller's buffer 
         */
        local_srcbuf.set_buffer(src->getptr(), strlen(src->getptr()));
        srcbuf = &local_srcbuf;
    }
    else if (src == 0)
    {
        /* 
         *   there's no source pointer - start at the beginning of the
         *   source buffer 
         */
        local_src.set((char *)srcbuf->get_text());
        src = &local_src;
    }

    /* clear the expansion buffer, unless we're appending to the buffer */
    if (!append)
        expbuf->clear_text();

    /* 
     *   Make sure we have room for a copy of the source line.  This is an
     *   optimization for the simple case where we'll just copy the source
     *   line unchanged, so that we don't have to repeatedly expand the
     *   buffer; we will, however, expand the buffer dynamically later, if
     *   this pre-allocation should prove to be insufficient. 
     */
    expbuf->ensure_space(expbuf->get_text_len() + srcbuf->get_text_len());

    /* note the starting offset, if we have an underlying string buffer */
    startofs = src->getptr() - srcbuf->get_text();

    /* read the first token */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* scan through the tokens on the line, looking for macros to expand */
    while (typ != TOKT_EOF)
    {
        /* 
         *   if it's a symbol, and it hasn't already been marked as fully
         *   expanded, look it up in the #define table 
         */
        if (typ == TOKT_SYM && !tok.get_fully_expanded())
        {
            CTcHashEntryPp *entry;

            /*
             *   Look up the symbol in the #define symbol table.  If we
             *   find it, expand the macro.  Otherwise, if the "defined"
             *   operator is active, check for that.
             *   
             *   Do not expand the macro if we find that it has already
             *   been expanded on a prior scan through the current text.  
             */
            entry = find_define(tok.get_text(), tok.get_text_len());
            if ((entry != 0
                 && !scan_for_prior_expansion(*src, srcbuf->get_text_end(),
                                              entry))
                || (allow_defined
                    && tok.get_text_len() == 7
                    && memcmp(tok.get_text(), "defined", 7) == 0))
            {
                size_t macro_ofs;
                size_t rem_len;
                int expanded;

                /* get the offset of the macro token in the source buffer */
                macro_ofs = tok.get_text() - srcbuf->get_text();
                
                /* expand it into our sub-expansion buffer */
                if (entry != 0)
                {
                    /* expand the macro */
                    err = expand_macro(res, subexp, srcbuf, src,
                                       macro_ofs, entry,
                                       read_more, allow_defined, &expanded);
                }
                else
                {
                    /* parse and expand the defined() operator */
                    err = expand_defined(subexp, srcbuf, src);

                    /* "defined" always expands if there's not an error */
                    expanded = TRUE;
                }

                /* if an error occurred, return failure */
                if (err)
                    goto done;

                /*
                 *   if we expanded something, append everything we
                 *   skipped preceding the macro, then rescan; otherwise,
                 *   just keep going without a rescan 
                 */
                if (expanded)
                {
                    /* copy the preceding text to the output */
                    expbuf->append(srcbuf->get_text() + startofs,
                                   macro_ofs - startofs);
                }
                else
                {
                    /* 
                     *   we didn't expand - get the next token after the
                     *   macro 
                     */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);

                    /* continue processing from this token */
                    continue;
                }

                /*
                 *   We must now insert the expansion into the source
                 *   buffer at the current point, and re-scan the
                 *   expansion, *along with* the rest of the original
                 *   source line (this is how ANSI C specifies the
                 *   process).
                 *   
                 *   If we can read more, we must be reading out of the
                 *   main input line buffer, so insert the expansion text
                 *   directly into the original source stream, and
                 *   continue reading out of the source stream; this will
                 *   simplify the case where we must read more data from
                 *   the file in the course of the expansion.  If we can't
                 *   read more, simply copy the remainder of the current
                 *   input line onto the expanded macro and use it as the
                 *   new input buffer.  
                 */

                /* get the current offset in the source line */
                startofs = src->getptr() - srcbuf->get_text();

                /* figure out how much is left on the current line */
                rem_len = srcbuf->get_text_len() - startofs;

                /* check to see if we can read more */
                if (read_more)
                {
                    /*
                     *   we're reading from the original line input buffer
                     *   -- insert the expansion into the source buffer at
                     *   the current point, replacing the original macro
                     *   text
                     */
                    
                    /* make sure we have room for adding the expansion text */
                    srcbuf->ensure_space(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* make sure src is still pointing to the right place */
                    src->set(srcbuf->get_buf() + macro_ofs);
                
                    /* move the remainder of the current line to make room */
                    memmove(srcbuf->get_buf() + macro_ofs
                            + subexp->get_text_len(),
                            srcbuf->get_buf() + startofs,
                            rem_len);
                
                    /* insert the expansion text */
                    memcpy(srcbuf->get_buf() + macro_ofs, subexp->get_buf(),
                           subexp->get_text_len());
                
                    /* set the new source length */
                    srcbuf->set_text_len(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* the new starting offset is the current position */
                    startofs = macro_ofs;

                    /* get the next token */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);
                    
                    /* continue processing from this token */
                    continue;
                }
                else
                {
                    /* 
                     *   we're reading from a read-only buffer -- add the
                     *   remainder of the source to the expansion buffer,
                     *   and recursively parse the remainder 
                     */
                    subexp->append(srcbuf->get_text() + startofs, rem_len);

                    /* 
                     *   evaluate the remainder recursively and append it
                     *   to the expansion already in progress 
                     */
                    err = expand_macros(subexp, 0, expbuf, FALSE,
                                        allow_defined, TRUE);

                    /* we're done */
                    goto done;
                }
            }
        }

        /* get the next token */
        typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);
    }

    /* add the remainder of the source to the output */
    expbuf->append(srcbuf->get_text() + startofs,
                   tok.get_text() - startofs - srcbuf->get_text());

done:
    /* release our macro resource object */
    release_macro_rsc(res);
    
    /* return the result */
    return err;
}